

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Float pbrt::SampleTrimmedLogistic(Float u,Float s,Float a,Float b)

{
  Float in_XMM0_Da;
  Float FVar1;
  Float b_00;
  float fVar2;
  float in_XMM2_Da;
  float in_XMM3_Da;
  Float x;
  anon_class_8_1_54a39813 P;
  Float in_stack_ffffffffffffffdc;
  Float in_stack_ffffffffffffffe4;
  
  FVar1 = SampleTrimmedLogistic::anon_class_8_1_54a39813::operator()
                    ((anon_class_8_1_54a39813 *)CONCAT44(in_stack_ffffffffffffffe4,in_XMM0_Da),
                     in_stack_ffffffffffffffdc);
  b_00 = SampleTrimmedLogistic::anon_class_8_1_54a39813::operator()
                   ((anon_class_8_1_54a39813 *)CONCAT44(in_stack_ffffffffffffffe4,in_XMM0_Da),FVar1)
  ;
  Lerp(in_XMM0_Da,FVar1,b_00);
  FVar1 = SampleLogistic(in_stack_ffffffffffffffe4,in_XMM0_Da);
  fVar2 = Clamp<float,float,float>(FVar1,in_XMM2_Da,in_XMM3_Da);
  return fVar2;
}

Assistant:

PBRT_CPU_GPU inline Float SampleTrimmedLogistic(Float u, Float s, Float a, Float b) {
    DCHECK_LT(a, b);
    auto P = [&](Float x) { return InvertLogisticSample(x, s); };
    u = Lerp(u, P(a), P(b));
    Float x = SampleLogistic(u, s);
    DCHECK(!IsNaN(x));
    return Clamp(x, a, b);
}